

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk80(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk80_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk80.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk80.version);
    if ((bios->power).unk80.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk80.offset + 1,&(bios->power).unk80.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk80.offset + 2,&(bios->power).unk80.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk80.offset + 3,&(bios->power).unk80.entriesnum);
      (bios->power).unk80.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk80.entriesnum;
      peVar5 = (envy_bios_power_unk80_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk80.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk80.rlen * (int)uVar6 +
             (uint)(bios->power).unk80.hlen + (bios->power).unk80.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER GR table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk80(struct envy_bios *bios) {
	struct envy_bios_power_unk80 *unk80 = &bios->power.unk80;
	int i, err = 0;

	if (!unk80->offset)
		return -EINVAL;

	bios_u8(bios, unk80->offset + 0x0, &unk80->version);
	switch(unk80->version) {
	case 0x10:
		err |= bios_u8(bios, unk80->offset + 0x1, &unk80->hlen);
		err |= bios_u8(bios, unk80->offset + 0x2, &unk80->rlen);
		err |= bios_u8(bios, unk80->offset + 0x3, &unk80->entriesnum);
		unk80->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER GR table version 0x%x\n", unk80->version);
		return -EINVAL;
	};

	err = 0;
	unk80->entries = malloc(unk80->entriesnum * sizeof(struct envy_bios_power_unk80_entry));
	for (i = 0; i < unk80->entriesnum; i++) {
		uint32_t data = unk80->offset + unk80->hlen + i * unk80->rlen;

		unk80->entries[i].offset = data;
	}

	return 0;
}